

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O2

QPointF __thiscall
QGraphicsProxyWidgetPrivate::mapToReceiver
          (QGraphicsProxyWidgetPrivate *this,QPointF *pos,QWidget *receiver)

{
  Data *pDVar1;
  QWidget *pQVar2;
  QPoint QVar3;
  qreal qVar4;
  qreal qVar5;
  QPointF QVar6;
  
  qVar4 = pos->xp;
  qVar5 = pos->yp;
  for (; receiver != (QWidget *)0x0; receiver = *(QWidget **)(*(long *)&receiver->field_0x8 + 0x10))
  {
    pDVar1 = (this->widget).wp.d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar2 = (QWidget *)0x0;
    }
    else {
      pQVar2 = (QWidget *)(this->widget).wp.value;
    }
    if (pQVar2 == receiver) break;
    QVar3 = QWidget::pos(receiver);
    qVar4 = qVar4 - (double)QVar3.xp.m_i.m_i;
    qVar5 = qVar5 - (double)QVar3.yp.m_i.m_i;
  }
  QVar6.yp = qVar5;
  QVar6.xp = qVar4;
  return QVar6;
}

Assistant:

QPointF QGraphicsProxyWidgetPrivate::mapToReceiver(const QPointF &pos, const QWidget *receiver) const
{
    QPointF p = pos;
    // Map event position from us to the receiver, preserving its
    // precision (don't use QWidget::mapFrom here).
    while (receiver && receiver != widget) {
        p -= QPointF(receiver->pos());
        receiver = receiver->parentWidget();
    }
    return p;
}